

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirmataI2c.cpp
# Opt level: O0

size_t __thiscall remote_wiring::FirmataI2c::_available(FirmataI2c *this)

{
  size_type sVar1;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock;
  FirmataI2c *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->_rx_mutex);
  sVar1 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_rx);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return sVar1;
}

Assistant:

size_t
FirmataI2c::_available (
    void
) {
    std::lock_guard<std::mutex> lock(_rx_mutex);
    return _rx.size();
}